

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFunctionalTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::ShaderLibraryGroup::init(ShaderLibraryGroup *this,EVP_PKEY_CTX *ctx)

{
  File *pFVar1;
  ShaderLibraryTest *this_00;
  long lVar2;
  long lVar3;
  
  lVar3 = 0x10;
  for (lVar2 = 0; lVar2 < this->m_numFiles; lVar2 = lVar2 + 1) {
    this_00 = (ShaderLibraryTest *)operator_new(0x98);
    pFVar1 = this->m_files;
    ShaderLibraryTest::ShaderLibraryTest
              (this_00,(this->super_TestCaseGroup).m_context,
               *(char **)((long)pFVar1 + lVar3 + -0x10),*(char **)((long)pFVar1 + lVar3 + -8),
               *(char **)((long)&pFVar1->fileName + lVar3));
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    lVar3 = lVar3 + 0x18;
  }
  return this->m_numFiles;
}

Assistant:

void init (void)
	{
		for (int ndx = 0; ndx < m_numFiles; ++ndx)
			addChild(new ShaderLibraryTest(m_context, m_files[ndx].fileName, m_files[ndx].testName, m_files[ndx].description));
	}